

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void llvm::sys::path::remove_filename(SmallVectorImpl<char> *path,Style style)

{
  char *pcVar1;
  StringRef local_50;
  size_t local_40;
  size_t end_pos;
  SmallVectorBase *pSStack_30;
  Style style_local;
  SmallVectorImpl<char> *path_local;
  size_t local_20;
  char *local_18;
  StringRef *local_10;
  
  pcVar1 = (char *)(path->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  end_pos._4_4_ = style;
  pSStack_30 = (SmallVectorBase *)path;
  path_local = path;
  local_20 = SmallVectorBase::size((SmallVectorBase *)path);
  local_10 = &local_50;
  local_50.Data = pcVar1;
  local_50.Length = local_20;
  local_18 = pcVar1;
  local_40 = anon_unknown.dwarf_232906::parent_path_end(local_50,end_pos._4_4_);
  if (local_40 != 0xffffffffffffffff) {
    SmallVectorBase::set_size(pSStack_30,local_40);
  }
  return;
}

Assistant:

void remove_filename(SmallVectorImpl<char> &path, Style style) {
  size_t end_pos = parent_path_end(StringRef(path.begin(), path.size()), style);
  if (end_pos != StringRef::npos)
    path.set_size(end_pos);
}